

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O2

Molecule * __thiscall
OpenMD::MoleculeCreator::createMolecule
          (MoleculeCreator *this,ForceField *ff,MoleculeStamp *molStamp,int globalIndex,
          LocalIndexManager *localIndexMan)

{
  double dVar1;
  pointer ppCVar2;
  Atom *sd;
  Atom *sd_00;
  int iVar3;
  Molecule *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  __first;
  undefined4 extraout_var_06;
  ConstraintElem *this_01;
  ConstraintElem *this_02;
  ConstraintPair *cp;
  CutoffGroup *pCVar4;
  long lVar5;
  pointer ppCVar6;
  pointer ppAVar7;
  ulong uVar8;
  undefined1 uVar9;
  long lVar10;
  bool bVar11;
  long local_68;
  Atom *atom;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> freeAtoms;
  
  this_00 = (Molecule *)operator_new(400);
  Molecule::Molecule(this_00,globalIndex,molStamp);
  lVar5 = (long)(molStamp->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  lVar10 = 0;
  while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
    iVar3 = (*this->_vptr_MoleculeCreator[2])
                      (this,ff,*(undefined8 *)
                                ((long)(molStamp->atomStamps_).
                                       super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start + (lVar10 >> 0x1d))
                       ,localIndexMan);
    atom = (Atom *)CONCAT44(extraout_var,iVar3);
    Molecule::addAtom(this_00,atom);
    lVar10 = lVar10 + 0x100000000;
  }
  lVar5 = (long)(molStamp->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  lVar10 = 0;
  while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
    iVar3 = (*this->_vptr_MoleculeCreator[3])
                      (this,molStamp,this_00,
                       *(undefined8 *)
                        ((long)(molStamp->rigidBodyStamps_).
                               super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + (lVar10 >> 0x1d)),
                       localIndexMan);
    Molecule::addRigidBody(this_00,(RigidBody *)CONCAT44(extraout_var_00,iVar3));
    lVar10 = lVar10 + 0x100000000;
  }
  lVar5 = (long)(molStamp->bondStamps_).
                super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->bondStamps_).
                super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  lVar10 = 0;
  while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
    iVar3 = (*this->_vptr_MoleculeCreator[4])
                      (this,ff,this_00,
                       *(undefined8 *)
                        ((long)(molStamp->bondStamps_).
                               super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + (lVar10 >> 0x1d)),
                       localIndexMan);
    Molecule::addBond(this_00,(Bond *)CONCAT44(extraout_var_01,iVar3));
    lVar10 = lVar10 + 0x100000000;
  }
  lVar5 = (long)(molStamp->bendStamps_).
                super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->bendStamps_).
                super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  lVar10 = 0;
  while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
    iVar3 = (*this->_vptr_MoleculeCreator[5])
                      (this,ff,this_00,
                       *(undefined8 *)
                        ((long)(molStamp->bendStamps_).
                               super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + (lVar10 >> 0x1d)),
                       localIndexMan);
    Molecule::addBend(this_00,(Bend *)CONCAT44(extraout_var_02,iVar3));
    lVar10 = lVar10 + 0x100000000;
  }
  lVar5 = (long)(molStamp->torsionStamps_).
                super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->torsionStamps_).
                super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  lVar10 = 0;
  while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
    iVar3 = (*this->_vptr_MoleculeCreator[6])
                      (this,ff,this_00,
                       *(undefined8 *)
                        ((long)(molStamp->torsionStamps_).
                               super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + (lVar10 >> 0x1d)),
                       localIndexMan);
    Molecule::addTorsion(this_00,(Torsion *)CONCAT44(extraout_var_03,iVar3));
    lVar10 = lVar10 + 0x100000000;
  }
  lVar5 = (long)(molStamp->inversionStamps_).
                super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->inversionStamps_).
                super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  lVar10 = 0;
  while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
    iVar3 = (*this->_vptr_MoleculeCreator[7])
                      (this,ff,this_00,
                       *(undefined8 *)
                        ((long)(molStamp->inversionStamps_).
                               super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + (lVar10 >> 0x1d)),
                       localIndexMan);
    if ((Inversion *)CONCAT44(extraout_var_04,iVar3) != (Inversion *)0x0) {
      Molecule::addInversion(this_00,(Inversion *)CONCAT44(extraout_var_04,iVar3));
    }
    lVar10 = lVar10 + 0x100000000;
  }
  lVar5 = (long)(molStamp->cutoffGroupStamps_).
                super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->cutoffGroupStamps_).
                super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  lVar10 = 0;
  while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
    iVar3 = (*this->_vptr_MoleculeCreator[8])
                      (this,this_00,
                       *(undefined8 *)
                        ((long)(molStamp->cutoffGroupStamps_).
                               super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + (lVar10 >> 0x1d)),
                       localIndexMan);
    Molecule::addCutoffGroup(this_00,(CutoffGroup *)CONCAT44(extraout_var_05,iVar3));
    lVar10 = lVar10 + 0x100000000;
  }
  freeAtoms.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  freeAtoms.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  freeAtoms.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppAVar7 = (this_00->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar7 !=
      (this_00->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_0016acd5;
  atom = (Atom *)0x0;
  do {
    do {
      if (atom == (Atom *)0x0) {
        ppCVar6 = (this_00->cutoffGroups_).
                  super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppCVar6 ==
            (this_00->cutoffGroups_).
            super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pCVar4 = (CutoffGroup *)0x0;
        }
        else {
          pCVar4 = *ppCVar6;
        }
        while (atom = (Atom *)0x0,
              ppAVar7 = freeAtoms.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start, pCVar4 != (CutoffGroup *)0x0) {
          ppAVar7 = (pCVar4->cutoffAtomList).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (ppAVar7 !=
              (pCVar4->cutoffAtomList).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_0016ad7d;
          atom = (Atom *)0x0;
          while (atom != (Atom *)0x0) {
            __first = std::
                      __remove_if<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Atom*const>>
                                ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                                  )freeAtoms.
                                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                 (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                                  )freeAtoms.
                                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,&atom);
            std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::erase
                      (&freeAtoms,(const_iterator)__first._M_current,
                       (const_iterator)
                       freeAtoms.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            ppAVar7 = ppAVar7 + 1;
            atom = (Atom *)0x0;
            if (ppAVar7 !=
                (pCVar4->cutoffAtomList).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
LAB_0016ad7d:
              atom = *ppAVar7;
            }
          }
          ppCVar6 = ppCVar6 + 1;
          pCVar4 = (CutoffGroup *)0x0;
          if (ppCVar6 !=
              (this_00->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pCVar4 = *ppCVar6;
          }
        }
        for (; ppAVar7 !=
               freeAtoms.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
               .super__Vector_impl_data._M_finish; ppAVar7 = ppAVar7 + 1) {
          iVar3 = (*this->_vptr_MoleculeCreator[9])(this,this_00,*ppAVar7,localIndexMan);
          Molecule::addCutoffGroup(this_00,(CutoffGroup *)CONCAT44(extraout_var_06,iVar3));
        }
        (*this->_vptr_MoleculeCreator[10])(this,this_00);
        local_68 = 0;
        for (uVar8 = 0;
            ppCVar2 = (molStamp->constraintStamps_).
                      super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            uVar8 < (ulong)((long)(molStamp->constraintStamps_).
                                  super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3);
            uVar8 = uVar8 + 1) {
          lVar5 = *(long *)((long)ppCVar2 + (local_68 >> 0x1d));
          if (*(char *)(lVar5 + 0xca) == '\0') {
            uVar9 = *(undefined1 *)(lVar5 + 0xcb);
          }
          else {
            uVar9 = false;
          }
          if (*(char *)(lVar5 + 0x92) == '\x01') {
            memcpy(&painCave,
                   "Constraint Error: A non-bond constraint was specified\n\twithout providing a value for the constrainedDistance.\n"
                   ,0x6f);
            painCave.isFatal = 1;
            simError();
          }
          else {
            ppAVar7 = (this_00->atoms_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            sd = ppAVar7[*(uint *)(lVar5 + 0xd0)];
            sd_00 = ppAVar7[*(uint *)(lVar5 + 0xd4)];
            dVar1 = *(double *)(lVar5 + 0x98);
            this_01 = (ConstraintElem *)operator_new(0x28);
            ConstraintElem::ConstraintElem(this_01,&sd->super_StuntDouble);
            this_02 = (ConstraintElem *)operator_new(0x28);
            ConstraintElem::ConstraintElem(this_02,&sd_00->super_StuntDouble);
            cp = (ConstraintPair *)operator_new(0x28);
            cp->consElem1_ = this_01;
            cp->consElem2_ = this_02;
            cp->dist2 = dVar1 * dVar1;
            cp->force_ = 0.0;
            cp->printForce_ = (bool)uVar9;
            Molecule::addConstraintPair(this_00,cp);
          }
          local_68 = local_68 + 0x100000000;
        }
        (*this->_vptr_MoleculeCreator[0xb])(this,this_00);
        if ((molStamp->ConstrainTotalCharge).super_ParameterBase.empty_ == false) {
          this_00->constrainTotalCharge_ =
               (bool)(molStamp->ConstrainTotalCharge).super_ParameterBase.field_0x2b;
        }
        Molecule::complete(this_00);
        std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
                  (&freeAtoms.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>);
        return this_00;
      }
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::push_back(&freeAtoms,&atom);
      ppAVar7 = ppAVar7 + 1;
      atom = (Atom *)0x0;
    } while (ppAVar7 ==
             (this_00->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
LAB_0016acd5:
    atom = *ppAVar7;
  } while( true );
}

Assistant:

Molecule* MoleculeCreator::createMolecule(ForceField* ff,
                                            MoleculeStamp* molStamp,
                                            int globalIndex,
                                            LocalIndexManager* localIndexMan) {
    Molecule* mol = new Molecule(globalIndex, molStamp);

    // create atoms
    Atom* atom;
    AtomStamp* currentAtomStamp;
    size_t nAtom = molStamp->getNAtoms();
    for (size_t i = 0; i < nAtom; ++i) {
      currentAtomStamp = molStamp->getAtomStamp(i);
      atom             = createAtom(ff, currentAtomStamp, localIndexMan);
      mol->addAtom(atom);
    }

    // create rigidbodies
    RigidBody* rb;
    RigidBodyStamp* currentRigidBodyStamp;
    size_t nRigidbodies = molStamp->getNRigidBodies();

    for (size_t i = 0; i < nRigidbodies; ++i) {
      currentRigidBodyStamp = molStamp->getRigidBodyStamp(i);
      rb = createRigidBody(molStamp, mol, currentRigidBodyStamp, localIndexMan);
      mol->addRigidBody(rb);
    }

    // create bonds
    Bond* bond;
    BondStamp* currentBondStamp;
    size_t nBonds = molStamp->getNBonds();

    for (size_t i = 0; i < nBonds; ++i) {
      currentBondStamp = molStamp->getBondStamp(i);
      bond             = createBond(ff, mol, currentBondStamp, localIndexMan);
      mol->addBond(bond);
    }

    // create bends
    Bend* bend;
    BendStamp* currentBendStamp;
    size_t nBends = molStamp->getNBends();
    for (size_t i = 0; i < nBends; ++i) {
      currentBendStamp = molStamp->getBendStamp(i);
      bend             = createBend(ff, mol, currentBendStamp, localIndexMan);
      mol->addBend(bend);
    }

    // create torsions
    Torsion* torsion;
    TorsionStamp* currentTorsionStamp;
    size_t nTorsions = molStamp->getNTorsions();
    for (size_t i = 0; i < nTorsions; ++i) {
      currentTorsionStamp = molStamp->getTorsionStamp(i);
      torsion = createTorsion(ff, mol, currentTorsionStamp, localIndexMan);
      mol->addTorsion(torsion);
    }

    // create inversions
    Inversion* inversion;
    InversionStamp* currentInversionStamp;
    size_t nInversions = molStamp->getNInversions();
    for (size_t i = 0; i < nInversions; ++i) {
      currentInversionStamp = molStamp->getInversionStamp(i);
      inversion =
          createInversion(ff, mol, currentInversionStamp, localIndexMan);
      if (inversion != NULL) { mol->addInversion(inversion); }
    }

    // create cutoffGroups
    CutoffGroup* cutoffGroup;
    CutoffGroupStamp* currentCutoffGroupStamp;
    size_t nCutoffGroups = molStamp->getNCutoffGroups();
    for (size_t i = 0; i < nCutoffGroups; ++i) {
      currentCutoffGroupStamp = molStamp->getCutoffGroupStamp(i);
      cutoffGroup =
          createCutoffGroup(mol, currentCutoffGroupStamp, localIndexMan);
      mol->addCutoffGroup(cutoffGroup);
    }

    // every free atom is a cutoff group
    std::vector<Atom*> freeAtoms;
    std::vector<Atom*>::iterator ai;
    std::vector<Atom*>::iterator fai;

    // add all atoms into allAtoms set
    for (atom = mol->beginAtom(fai); atom != NULL; atom = mol->nextAtom(fai)) {
      freeAtoms.push_back(atom);
    }

    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    for (cg = mol->beginCutoffGroup(ci); cg != NULL;
         cg = mol->nextCutoffGroup(ci)) {
      for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
        // erase the atoms belong to cutoff groups from freeAtoms vector
        freeAtoms.erase(std::remove(freeAtoms.begin(), freeAtoms.end(), atom),
                        freeAtoms.end());
      }
    }

    // loop over the free atoms and then create one cutoff group for
    // every single free atom

    for (fai = freeAtoms.begin(); fai != freeAtoms.end(); ++fai) {
      cutoffGroup = createCutoffGroup(mol, *fai, localIndexMan);
      mol->addCutoffGroup(cutoffGroup);
    }

    // create bonded constraintPairs:
    createConstraintPair(mol);

    // create non-bonded constraintPairs
    for (std::size_t i = 0; i < molStamp->getNConstraints(); ++i) {
      ConstraintStamp* cStamp = molStamp->getConstraintStamp(i);
      Atom* atomA;
      Atom* atomB;

      atomA = mol->getAtomAt(cStamp->getA());
      atomB = mol->getAtomAt(cStamp->getB());
      assert(atomA && atomB);

      bool printConstraintForce = false;

      if (cStamp->havePrintConstraintForce()) {
        printConstraintForce = cStamp->getPrintConstraintForce();
      }

      if (!cStamp->haveConstrainedDistance()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Constraint Error: A non-bond constraint was specified\n"
                 "\twithout providing a value for the constrainedDistance.\n");
        painCave.isFatal = 1;
        simError();
      } else {
        RealType distance         = cStamp->getConstrainedDistance();
        ConstraintElem* consElemA = new ConstraintElem(atomA);
        ConstraintElem* consElemB = new ConstraintElem(atomB);
        ConstraintPair* cPair     = new ConstraintPair(
            consElemA, consElemB, distance, printConstraintForce);
        mol->addConstraintPair(cPair);
      }
    }

    // now create the constraint elements:

    createConstraintElem(mol);

    // Does this molecule stamp define a total constrained charge value?
    // If so, let the created molecule know about it.
    if (molStamp->haveConstrainTotalCharge()) {
      mol->setConstrainTotalCharge(molStamp->getConstrainTotalCharge());
    }

    // The construction of this molecule is finished:
    mol->complete();

    return mol;
  }